

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# args_test.c
# Opt level: O3

void test_arg_only(void)

{
  int iVar1;
  char *local_48;
  char *av [2];
  char *local_30;
  int local_28;
  int local_24;
  int opti;
  int v;
  
  local_28 = 1;
  local_48 = "program";
  av[0] = "123";
  iVar1 = nng_args_parse(2,&local_48,case1,&local_24,&local_30,&local_28);
  acutest_check_((uint)(iVar1 == -1),
                 "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/core/args_test.c"
                 ,0xdb,"%s","nng_args_parse(ac, av, case1, &v, &a, &opti) == -1");
  acutest_check_((uint)(local_28 == 1),
                 "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/core/args_test.c"
                 ,0xdc,"%s","opti == 1");
  return;
}

Assistant:

void
test_arg_only(void)
{
	int   opti = 1;
	char *av[2];
	int   ac = 2;
	int   v;
	char *a = NULL;

	av[0] = "program";
	av[1] = "123";
	NUTS_TRUE(nng_args_parse(ac, av, case1, &v, &a, &opti) == -1);
	NUTS_TRUE(opti == 1);
}